

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O1

parse_error * __thiscall
nlohmann::detail::parse_error::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (parse_error *__return_storage_ptr__,parse_error *this,int id_,position_t *pos,
          string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  size_t sVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong *puVar5;
  long *plVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  undefined8 uVar8;
  string w;
  ulong *local_150;
  position_t *local_148;
  ulong local_140;
  long lStack_138;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  ulong local_e8;
  ulong local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parse_error","");
  exception::name(&local_50,&local_b0,(int)this);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_140 = *puVar5;
    lStack_138 = plVar2[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar5;
    local_150 = (ulong *)*plVar2;
  }
  local_148 = (position_t *)plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  position_string_abi_cxx11_(&local_d0,(parse_error *)CONCAT44(in_register_00000014,id_),local_148);
  uVar4 = (long)&local_148->chars_read_total + local_d0._M_string_length;
  uVar7 = 0xf;
  if (local_150 != &local_140) {
    uVar7 = local_140;
  }
  if (uVar7 < uVar4) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar8 = local_d0.field_2._M_allocated_capacity;
    }
    if (uVar4 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
      goto LAB_00127131;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0._M_dataplus._M_p);
LAB_00127131:
  local_130 = &local_120;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_120 = *plVar2;
    uStack_118 = puVar3[3];
  }
  else {
    local_120 = *plVar2;
    local_130 = (long *)*puVar3;
  }
  local_128 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_e0 = *puVar5;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar5;
    local_f0 = (ulong *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_68 = 0;
  local_60 = 0;
  uVar4 = 0xf;
  if (local_f0 != &local_e0) {
    uVar4 = local_e0;
  }
  local_70 = &local_60;
  if ((local_e8 < 0x10) && (uVar4 < local_e8)) {
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_f0);
  }
  else {
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)&local_60);
  }
  local_110 = &local_100;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_100 = *plVar2;
    uStack_f8 = puVar3[3];
  }
  else {
    local_100 = *plVar2;
    local_110 = (long *)*puVar3;
  }
  local_108 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_110,pos->chars_read_total);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  sVar1 = *(size_t *)&((parse_error *)CONCAT44(in_register_00000014,id_))->super_exception;
  exception::exception(&__return_storage_ptr__->super_exception,(int)this,(char *)local_90);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_001a1630;
  __return_storage_ptr__->byte = sVar1;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static parse_error create(int id_, const position_t& pos, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("parse_error", id_) + "parse error" +
                        position_string(pos) + ": " + exception::diagnostics(context) + what_arg;
        return {id_, pos.chars_read_total, w.c_str()};
    }